

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

void __thiscall
DReachabilityPropagator::reverseDFStoBorder
          (DReachabilityPropagator *this,int u,vector<bool,_std::allocator<bool>_> *v,
          vector<bool,_std::allocator<bool>_> *my_side,vec<Lit> *expl,int skip_n)

{
  uint uVar1;
  pointer pvVar2;
  uint *puVar3;
  BoolView *pBVar4;
  bool bVar5;
  int iVar6;
  size_type __n;
  uint *puVar7;
  reference rVar8;
  Lit local_4c;
  vec<Lit> *local_48;
  vector<bool,_std::allocator<bool>_> *local_40;
  vector<bool,_std::allocator<bool>_> *local_38;
  
  __n = (size_type)u;
  local_48 = expl;
  local_40 = my_side;
  local_38 = v;
  rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](v,__n);
  *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
  pvVar2 = (this->in).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar7 = *(uint **)&pvVar2[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
  puVar3 = (uint *)pvVar2[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  do {
    if (puVar7 == puVar3) {
      return;
    }
    uVar1 = *puVar7;
    pBVar4 = (this->super_GraphPropagator).es.data;
    if (sat.assigns.data[(uint)pBVar4[uVar1].v] == '\0') {
LAB_001a6af0:
      iVar6 = *(this->super_GraphPropagator).endnodes.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar1].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (iVar6 != skip_n) {
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](local_38,(long)iVar6);
        if ((*rVar8._M_p & rVar8._M_mask) == 0) {
          reverseDFStoBorder(this,iVar6,local_38,local_40,local_48,skip_n);
        }
      }
    }
    else {
      bVar5 = BoolView::isFalse(pBVar4 + uVar1);
      if (!bVar5) goto LAB_001a6af0;
      iVar6 = (*(this->lt->super_LengauerTarjan)._vptr_LengauerTarjan[7])
                        (this->lt,(ulong)**(uint **)&(this->super_GraphPropagator).endnodes.
                                                                                                          
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data);
      if ((char)iVar6 == '\0') goto LAB_001a6af0;
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (local_40,(long)*(this->super_GraphPropagator).endnodes.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[(int)uVar1].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start);
      if ((*rVar8._M_p & rVar8._M_mask) != 0) goto LAB_001a6af0;
      local_4c = BoolView::getValLit((this->super_GraphPropagator).es.data + uVar1);
      vec<Lit>::push(local_48,&local_4c);
    }
    puVar7 = puVar7 + 1;
  } while( true );
}

Assistant:

void DReachabilityPropagator::reverseDFStoBorder(int u, std::vector<bool>& v,
																								 std::vector<bool>& my_side, vec<Lit>& expl,
																								 int skip_n) {
	if (DEBUG) {
		std::cout << "Reverse DFS to border from " << u << '\n';
	}
	v[u] = true;
	for (const int ie : in[u]) {
		if (getEdgeVar(ie).isFixed() && getEdgeVar(ie).isFalse() && lt->visited_dfs(getTail(ie)) &&
				!my_side[getTail(ie)]) {
			expl.push(getEdgeVar(ie).getValLit());
			if (DEBUG) {
				std::cout << "Added to explanation for dom/bridge edge:" << ie << '\n';
			}
		} else {
			const int o = getTail(ie);
			if (o == skip_n || v[o]) {
				continue;
			}
			reverseDFStoBorder(o, v, my_side, expl, skip_n);
		}
	}
}